

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_details.hpp
# Opt level: O0

bool __thiscall
Infector::Container::resolve_multiple_inheritance_inner<IBedVS>(Container *this,type_index T)

{
  bool bVar1;
  mapped_type *pmVar2;
  type_index local_58;
  type_info *local_50;
  Binding local_48;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
  local_38;
  type_index local_30;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
  local_28;
  iterator it;
  Container *this_local;
  type_index T_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
            )(_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
              )this;
  std::type_index::type_index(&local_30,(type_info *)&IBedVS::typeinfo);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
       ::find(&this->typeMap,&local_30);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
       ::end(&this->typeMap);
  bVar1 = std::__detail::operator!=(&local_28,&local_38);
  if (!bVar1) {
    local_50 = T._M_target;
    Binding::Binding(&local_48,T,true);
    std::type_index::type_index(&local_58,(type_info *)&IBedVS::typeinfo);
    pmVar2 = std::
             unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
             ::operator[](&this->typeMap,&local_58);
    (pmVar2->type)._M_target = local_48.type._M_target;
    pmVar2->single = local_48.single;
  }
  T_local._M_target._7_1_ = !bVar1;
  return T_local._M_target._7_1_;
}

Assistant:

bool Container::resolve_multiple_inheritance_inner(std::type_index T){

        auto it = typeMap.find(   std::type_index(typeid(Contract)) );
        if( it!=typeMap.end())
            return false;

        typeMap[std::type_index(typeid(Contract))]
                = Binding(T, true);
        return true;
    }